

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O2

bool __thiscall slang::ast::Type::isVirtualInterfaceOrArray(Type *this)

{
  SymbolKind SVar1;
  bool bVar2;
  Type *this_00;
  
  while( true ) {
    this_00 = getCanonicalType(this);
    SVar1 = (this_00->super_Symbol).kind;
    if ((QueueType < SVar1) || ((0x26000U >> (SVar1 & UntypedType) & 1) == 0)) break;
    this = getArrayElementType(this_00);
  }
  bVar2 = isVirtualInterface(this_00);
  return bVar2;
}

Assistant:

bool Type::isVirtualInterfaceOrArray() const {
    auto ct = &getCanonicalType();
    while (true) {
        switch (ct->kind) {
            case SymbolKind::FixedSizeUnpackedArrayType:
            case SymbolKind::DynamicArrayType:
            case SymbolKind::QueueType:
                ct = &ct->getArrayElementType()->getCanonicalType();
                break;
            default:
                return ct->isVirtualInterface();
        }
    }
}